

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLevel3DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,Vec3 *coord,UVec4 *result)

{
  uint uVar1;
  uint uVar2;
  Sampler *pSVar3;
  ConstPixelBufferAccess *format;
  int ndx;
  int iVar4;
  int iVar5;
  int z;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int c;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vector<bool,_4> res_3;
  Vector<bool,_4> res_2;
  Vector<bool,_4> res_1;
  Vec2 uBounds;
  Vector<unsigned_int,_4> res;
  Vector<unsigned_int,_4> color;
  Vec2 wBounds;
  Vec2 vBounds;
  bool local_b5;
  int local_ac;
  int local_9c;
  undefined4 local_98;
  int local_94;
  int local_90;
  undefined4 local_8c;
  undefined4 local_88;
  int local_84;
  Sampler *local_80;
  ConstPixelBufferAccess *local_78;
  float local_70;
  float local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  tcu local_50 [16];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_70,sampler->normalizedCoords,(access->m_size).m_data[0],
             coord->m_data[0],*(int *)prec,*(int *)(prec + 0xc));
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(access->m_size).m_data[1],
             coord->m_data[1],*(int *)(prec + 4),*(int *)(prec + 0x10));
  local_80 = sampler;
  local_78 = access;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(access->m_size).m_data[2],
             coord->m_data[2],*(int *)(prec + 8),*(int *)(prec + 0x14));
  fVar11 = floorf(local_70);
  fVar12 = floorf(local_6c);
  fVar13 = floorf(local_38);
  fVar14 = floorf(local_34);
  fVar15 = floorf(local_40);
  local_9c = (int)fVar15;
  fVar15 = floorf(local_3c);
  format = local_78;
  pSVar3 = local_80;
  local_84 = (int)fVar15;
  local_b5 = local_9c <= local_84;
  if (local_9c <= local_84) {
    local_90 = (int)fVar11;
    iVar9 = (int)fVar14;
    local_b5 = true;
    local_94 = (int)fVar13;
    do {
      if (local_94 <= iVar9) {
        local_ac = local_94;
        iVar4 = (int)fVar13;
        do {
          for (c = local_90; c <= (int)fVar12; c = c + 1) {
            iVar5 = TexVerifierUtil::wrap(pSVar3->wrapS,c,(format->m_size).m_data[0]);
            z = TexVerifierUtil::wrap(pSVar3->wrapT,local_ac,(format->m_size).m_data[1]);
            iVar6 = TexVerifierUtil::wrap(pSVar3->wrapR,local_9c,(format->m_size).m_data[2]);
            if ((((iVar5 < 0) || ((format->m_size).m_data[0] <= iVar5)) || (z < 0)) ||
               ((((format->m_size).m_data[1] <= z || (iVar6 < 0)) ||
                ((format->m_size).m_data[2] <= iVar6)))) {
              sampleTextureBorder<unsigned_int>(local_50,&format->m_format,local_80);
            }
            else {
              ConstPixelBufferAccess::getPixelT<unsigned_int>
                        ((ConstPixelBufferAccess *)local_50,(int)format,iVar5,z);
            }
            local_68 = 0;
            uStack_60 = 0;
            lVar7 = 0;
            do {
              uVar1 = result->m_data[lVar7];
              uVar2 = *(uint *)(local_50 + lVar7 * 4);
              iVar5 = uVar1 - uVar2;
              if (uVar1 < uVar2) {
                iVar5 = -(uVar1 - uVar2);
              }
              *(int *)((long)&local_68 + lVar7 * 4) = iVar5;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_88 = 0;
            lVar7 = 0;
            do {
              *(bool *)((long)&local_88 + lVar7) =
                   *(uint *)((long)&local_68 + lVar7 * 4) <= *(uint *)(prec + lVar7 * 4 + 0x18);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_8c = 0;
            lVar7 = 0;
            do {
              *(byte *)((long)&local_8c + lVar7) = (byte)prec[lVar7 + 0x28] ^ 1;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_98 = 0;
            lVar7 = 0;
            do {
              *(byte *)((long)&local_98 + lVar7) =
                   *(byte *)((long)&local_8c + lVar7) | *(byte *)((long)&local_88 + lVar7);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            if ((char)local_98 != '\0') {
              uVar8 = 0xffffffffffffffff;
              do {
                if (uVar8 == 2) {
                  uVar10 = 3;
                  break;
                }
                uVar10 = uVar8 + 1;
                lVar7 = uVar8 + 2;
                uVar8 = uVar10;
              } while (*(char *)((long)&local_98 + lVar7) != '\0');
              if (2 < uVar10) {
                if (iVar4 <= iVar9) {
                  return local_b5;
                }
                goto LAB_00ac8b60;
              }
            }
          }
          local_ac = local_ac + 1;
          iVar4 = local_ac;
        } while (local_ac <= iVar9);
      }
LAB_00ac8b60:
      local_9c = local_9c + 1;
      local_b5 = local_9c <= local_84;
    } while (local_9c <= local_84);
  }
  return local_b5;
}

Assistant:

bool isLevel3DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const Vec3&					coord,
								 const UVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coord, result);
}